

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btok_cvc.c
# Opt level: O0

err_t btokParamsStd(bign_params *params,size_t privkey_len)

{
  long in_RSI;
  bign_params *in_stack_ffffffffffffffd8;
  undefined4 local_4;
  
  if (in_RSI == 0x18) {
    local_4 = bign96ParamsStd(in_stack_ffffffffffffffd8,(char *)0x172ca8);
  }
  else if (in_RSI == 0x20) {
    local_4 = bignParamsStd(in_stack_ffffffffffffffd8,(char *)0x172cbf);
  }
  else if (in_RSI == 0x30) {
    local_4 = bignParamsStd(in_stack_ffffffffffffffd8,(char *)0x172cd6);
  }
  else if (in_RSI == 0x40) {
    local_4 = bignParamsStd(in_stack_ffffffffffffffd8,(char *)0x172ced);
  }
  else {
    local_4 = 0x6d;
  }
  return local_4;
}

Assistant:

static err_t btokParamsStd(bign_params* params, size_t privkey_len)
{
	switch (privkey_len)
	{
	case 24:
		return bign96ParamsStd(params, "1.2.112.0.2.0.34.101.45.3.0");
	case 32:
		return bignParamsStd(params, "1.2.112.0.2.0.34.101.45.3.1");
	case 48:
		return bignParamsStd(params, "1.2.112.0.2.0.34.101.45.3.2");
	case 64:
		return bignParamsStd(params, "1.2.112.0.2.0.34.101.45.3.3");
	}
	return ERR_BAD_INPUT;
}